

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

double __thiscall TerminalOutput::log(TerminalOutput *this,double __x)

{
  FILE *pFVar1;
  int iVar2;
  SafeBool p_Var3;
  SafeBool p_Var4;
  int in_ECX;
  char *in_RDX;
  Flags<LogOutput::LogFlag> *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar5;
  FILE *local_88;
  Flags<LogFlag> local_70;
  Flags<LogFlag> local_68;
  Flags<LogOutput::LogFlag> local_60;
  Flags<LogOutput::LogFlag> local_58;
  Flags<LogOutput::LogFlag> local_50;
  Flags<LogOutput::LogFlag> local_48;
  Flags<LogOutput::LogFlag> local_40;
  Flags<LogOutput::LogFlag> local_38;
  FILE *local_30;
  FILE *f;
  char *pcStack_20;
  int len_local;
  char *msg_local;
  Flags<LogOutput::LogFlag> *flags_local;
  TerminalOutput *this_local;
  
  f._4_4_ = in_ECX;
  pcStack_20 = in_RDX;
  flags_local = (Flags<LogOutput::LogFlag> *)this;
  Flags<LogOutput::LogFlag>::Flags(&local_40,in_RSI);
  operator&(&local_38,(LogFlag)&local_40);
  p_Var3 = Flags::operator_cast_to_function_pointer((Flags *)&local_38);
  if (p_Var3 == (SafeBool)0x0) {
    local_88 = _stderr;
  }
  else {
    local_88 = _stdout;
  }
  local_30 = local_88;
  Flags<LogOutput::LogFlag>::Flags(&local_50,in_RSI);
  operator&(&local_48,(LogFlag)&local_50);
  p_Var3 = Flags::operator_cast_to_function_pointer((Flags *)&local_48);
  if (p_Var3 == (SafeBool)0x0) {
    if (*(int *)&(this->super_LogOutput).field_0x1c != 0) {
      fwrite("\n",1,1,local_30);
    }
    pFVar1 = local_30;
    *(undefined4 *)&(this->super_LogOutput).field_0x1c = 0;
    Flags<LogOutput::LogFlag>::Flags(&local_60,in_RSI);
    writeLog((FILE *)pFVar1,pcStack_20,f._4_4_,&local_60);
    Flags<LogFlag>::Flags(&local_70,&this->mFlags);
    operator&(&local_68,(LogFlag)&local_70);
    p_Var4 = Flags::operator_cast_to_function_pointer((Flags *)&local_68);
    dVar5 = extraout_XMM0_Qa_00;
    if (p_Var4 != (SafeBool)0x0) {
      fflush(local_30);
      dVar5 = extraout_XMM0_Qa_01;
    }
  }
  else {
    if (*(int *)&(this->super_LogOutput).field_0x1c != 0) {
      fwrite("\r",1,1,local_30);
      while (iVar2 = *(int *)&(this->super_LogOutput).field_0x1c,
            *(int *)&(this->super_LogOutput).field_0x1c = iVar2 + -1, iVar2 != 0) {
        fwrite(" ",1,1,local_30);
      }
      fwrite("\r",1,1,local_30);
    }
    pFVar1 = local_30;
    Flags<LogOutput::LogFlag>::Flags(&local_58,in_RSI);
    iVar2 = writeLog((FILE *)pFVar1,pcStack_20,f._4_4_,&local_58);
    *(int *)&(this->super_LogOutput).field_0x1c = iVar2;
    dVar5 = extraout_XMM0_Qa;
  }
  return dVar5;
}

Assistant:

virtual void log(Flags<LogOutput::LogFlag> flags, const char *msg, int len) override
    {
        FILE *f = flags & StdOut ? stdout : stderr;
        if (flags & Replaceable) {
            if (mReplaceableLength) {
                fwrite("\r", 1, 1, f);
                while (mReplaceableLength--)
                    fwrite(" ", 1, 1, f);
                fwrite("\r", 1, 1, f);
            }
            mReplaceableLength = writeLog(f, msg, len, flags);
        } else {
            if (mReplaceableLength)
                fwrite("\n", 1, 1, f);
            mReplaceableLength = 0;
            writeLog(f, msg, len, flags);
            if (mFlags & ::LogFlush) {
                fflush(f);
            }
        }
    }